

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O1

uv_stream_t * __thiscall anon_unknown.dwarf_671e2b::ImplPosix::GetReader(ImplPosix *this)

{
  long lVar1;
  uv_stream_t *puVar2;
  
  if (this->Conn == FDs) {
    lVar1 = 0x70;
  }
  else {
    if (this->Conn != FIFO) {
      return (uv_stream_t *)0x0;
    }
    lVar1 = 0x90;
  }
  puVar2 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                     ((uv_pipe_ptr *)((long)&(this->super_Impl)._vptr_Impl + lVar1));
  return puVar2;
}

Assistant:

uv_stream_t* ImplPosix::GetReader() const
{
  switch (this->Conn) {
    case Connection::FDs:
      return this->ConnRead;
    case Connection::FIFO:
      return this->ConnFIFO;
    default:
      return nullptr;
  }
}